

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.hpp
# Opt level: O0

void __thiscall
soplex::
SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setPrimalStatus(SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,Desc *desc,
                 SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *base,SPxId *id)

{
  bool bVar1;
  type_conflict5 tVar2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar3;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  ulong *puVar4;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  cpp_dec_float<50U,_int,_void> *pcVar5;
  bool *pbVar6;
  Status *pSVar7;
  SPxId *in_RCX;
  long in_RDI;
  int n_1;
  int n;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffbc8;
  int iVar8;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffbd0;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffbd8;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffbe0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3d0;
  undefined1 local_398 [56];
  ulong local_360;
  undefined1 local_358 [56];
  ulong local_320;
  undefined1 local_314 [56];
  undefined1 local_2dc [56];
  SPxColId local_2a4;
  int local_29c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_298;
  undefined1 local_260 [56];
  ulong local_228;
  undefined1 local_220 [56];
  ulong local_1e8;
  undefined1 local_1dc [56];
  undefined1 local_1a4 [56];
  SPxRowId local_16c;
  int local_164;
  SPxId *local_160;
  undefined8 local_140;
  undefined8 local_138;
  undefined1 *local_130;
  undefined8 local_128;
  ulong *local_120;
  undefined1 *local_118;
  undefined8 local_110;
  ulong *local_108;
  undefined1 *local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  ulong *local_d8;
  undefined1 *local_d0;
  undefined8 local_c8;
  ulong *local_c0;
  undefined1 *local_b8;
  ulong *local_b0;
  ulong *local_a8;
  undefined8 local_a0;
  ulong *local_98;
  ulong *local_90;
  undefined8 local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  cpp_dec_float<50U,_int,_void> *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  cpp_dec_float<50U,_int,_void> *local_50;
  undefined1 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_160 = in_RCX;
  bVar1 = SPxId::isSPxRowId(in_RCX);
  if (bVar1) {
    SPxRowId::SPxRowId(&local_16c,local_160);
    local_164 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::number(in_stack_fffffffffffffbd0,(SPxRowId *)in_stack_fffffffffffffbc8);
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::rhs(in_stack_fffffffffffffbd0,(int)((ulong)in_stack_fffffffffffffbc8 >> 0x20));
    local_138 = infinity();
    local_130 = local_1a4;
    local_140 = 0;
    local_88 = local_138;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffffbe0,(double)in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0
              );
    tVar2 = boost::multiprecision::operator>=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffffbc8,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x464aa6);
    iVar8 = (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
    if (tVar2) {
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::lhs(in_stack_fffffffffffffbd0,iVar8);
      puVar4 = (ulong *)infinity();
      local_1e8 = *puVar4 ^ 0x8000000000000000;
      local_118 = local_1dc;
      local_120 = &local_1e8;
      local_128 = 0;
      local_90 = local_120;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (in_stack_fffffffffffffbe0,(double)in_stack_fffffffffffffbd8,
                 in_stack_fffffffffffffbd0);
      tVar2 = boost::multiprecision::operator<=
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffffbc8,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x464b5c);
      iVar8 = (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
      if (tVar2) {
        pSVar7 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::Desc::rowStatus((Desc *)in_stack_fffffffffffffbd0,iVar8);
        *pSVar7 = P_FREE;
      }
      else {
        pSVar7 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::Desc::rowStatus((Desc *)in_stack_fffffffffffffbd0,iVar8);
        *pSVar7 = P_ON_LOWER;
      }
    }
    else {
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::lhs(in_stack_fffffffffffffbd0,iVar8);
      puVar4 = (ulong *)infinity();
      local_228 = *puVar4 ^ 0x8000000000000000;
      local_100 = local_220;
      local_108 = &local_228;
      local_110 = 0;
      local_98 = local_108;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (in_stack_fffffffffffffbe0,(double)in_stack_fffffffffffffbd8,
                 in_stack_fffffffffffffbd0);
      tVar2 = boost::multiprecision::operator<=
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffffbc8,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x464c4a);
      iVar8 = (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
      if (tVar2) {
        pSVar7 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::Desc::rowStatus((Desc *)in_stack_fffffffffffffbd0,iVar8);
        *pSVar7 = P_ON_UPPER;
      }
      else {
        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::lhs(in_stack_fffffffffffffbd0,iVar8);
        pnVar3 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::rhs(in_stack_fffffffffffffbd0,(int)((ulong)in_stack_fffffffffffffbc8 >> 0x20));
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::epsilon(in_stack_fffffffffffffbd8);
        local_28 = local_260;
        local_38 = &local_298;
        local_30 = pnVar3;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_39,pnVar3,local_38);
        local_20 = local_260;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffbd0);
        local_8 = local_260;
        local_10 = local_30;
        local_18 = local_38;
        boost::multiprecision::default_ops::
        eval_subtract<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffbd0,
                   in_stack_fffffffffffffbc8,(cpp_dec_float<50U,_int,_void> *)0x464d6a);
        tVar2 = boost::multiprecision::operator>=
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_fffffffffffffbc8,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x464d7c);
        iVar8 = (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
        if (tVar2) {
          pSVar7 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::Desc::rowStatus((Desc *)in_stack_fffffffffffffbd0,iVar8);
          *pSVar7 = P_FIXED;
        }
        else {
          pbVar6 = DataArray<bool>::operator[]((DataArray<bool> *)(in_RDI + 0x78),local_164);
          if ((*pbVar6 & 1U) == 0) {
            pSVar7 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::Desc::rowStatus((Desc *)in_stack_fffffffffffffbd0,iVar8);
            *pSVar7 = P_ON_LOWER;
          }
          else {
            pSVar7 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::Desc::rowStatus((Desc *)in_stack_fffffffffffffbd0,iVar8);
            *pSVar7 = P_ON_UPPER;
          }
        }
      }
    }
  }
  else {
    SPxColId::SPxColId(&local_2a4,local_160);
    local_29c = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::number(in_stack_fffffffffffffbd0,(SPxColId *)in_stack_fffffffffffffbc8);
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::upper(in_stack_fffffffffffffbd0,(int)((ulong)in_stack_fffffffffffffbc8 >> 0x20));
    local_f0 = infinity();
    local_e8 = local_2dc;
    local_f8 = 0;
    local_a0 = local_f0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffffbe0,(double)in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0
              );
    tVar2 = boost::multiprecision::operator>=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffffbc8,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x464eb5);
    iVar8 = (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
    if (tVar2) {
      pcVar5 = &SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::lower(in_stack_fffffffffffffbd0,iVar8)->m_backend;
      puVar4 = (ulong *)infinity();
      local_320 = *puVar4 ^ 0x8000000000000000;
      local_d0 = local_314;
      local_d8 = &local_320;
      local_e0 = 0;
      local_a8 = local_d8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (pcVar5,(double)in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
      tVar2 = boost::multiprecision::operator<=
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffffbc8,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x464f6b);
      iVar8 = (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
      if (tVar2) {
        pSVar7 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::Desc::colStatus((Desc *)in_stack_fffffffffffffbd0,iVar8);
        *pSVar7 = P_FREE;
      }
      else {
        pSVar7 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::Desc::colStatus((Desc *)in_stack_fffffffffffffbd0,iVar8);
        *pSVar7 = P_ON_LOWER;
      }
    }
    else {
      this_00 = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::lower(in_stack_fffffffffffffbd0,iVar8);
      puVar4 = (ulong *)infinity();
      local_360 = *puVar4 ^ 0x8000000000000000;
      local_b8 = local_358;
      local_c0 = &local_360;
      local_c8 = 0;
      local_b0 = local_c0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (in_stack_fffffffffffffbe0,(double)this_00,in_stack_fffffffffffffbd0);
      tVar2 = boost::multiprecision::operator<=
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffffbc8,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x465059);
      iVar8 = (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
      if (tVar2) {
        pSVar7 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::Desc::colStatus((Desc *)in_stack_fffffffffffffbd0,iVar8);
        *pSVar7 = P_ON_UPPER;
      }
      else {
        this_01 = (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::lower(in_stack_fffffffffffffbd0,iVar8);
        pcVar5 = &SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::upper(this_01,iVar8)->m_backend;
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::epsilon(this_00);
        local_68 = local_398;
        local_78 = &local_3d0;
        local_70 = pcVar5;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_79,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)pcVar5,local_78);
        local_60 = local_398;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)this_01);
        local_48 = local_398;
        local_50 = local_70;
        local_58 = local_78;
        boost::multiprecision::default_ops::
        eval_subtract<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((cpp_dec_float<50U,_int,_void> *)this_01,pcVar5,
                   (cpp_dec_float<50U,_int,_void> *)0x465171);
        tVar2 = boost::multiprecision::operator>=
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)pcVar5,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x465183);
        iVar8 = (int)((ulong)pcVar5 >> 0x20);
        if (tVar2) {
          pSVar7 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::Desc::colStatus((Desc *)this_01,iVar8);
          *pSVar7 = P_FIXED;
        }
        else {
          pbVar6 = DataArray<bool>::operator[]((DataArray<bool> *)(in_RDI + 0x90),local_29c);
          if ((*pbVar6 & 1U) == 0) {
            pSVar7 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::Desc::colStatus((Desc *)this_01,iVar8);
            *pSVar7 = P_ON_LOWER;
          }
          else {
            pSVar7 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::Desc::colStatus((Desc *)this_01,iVar8);
            *pSVar7 = P_ON_UPPER;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void SPxWeightST<R>::setPrimalStatus(
   typename SPxBasisBase<R>::Desc& desc,
   const SPxSolverBase<R>& base,
   const SPxId& id)
{
   if(id.isSPxRowId())
   {
      int n = base.number(SPxRowId(id));

      if(base.rhs(n) >= R(infinity))
      {
         if(base.lhs(n) <= R(-infinity))
            desc.rowStatus(n) = SPxBasisBase<R>::Desc::P_FREE;
         else
            desc.rowStatus(n) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      }
      else
      {
         if(base.lhs(n) <= R(-infinity))
            desc.rowStatus(n) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         else if(base.lhs(n) >= base.rhs(n) - base.epsilon())
            desc.rowStatus(n) = SPxBasisBase<R>::Desc::P_FIXED;
         else if(rowRight[n])
            desc.rowStatus(n) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         else
            desc.rowStatus(n) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      }
   }
   else
   {
      int n = base.number(SPxColId(id));

      if(base.SPxLPBase<R>::upper(n) >= R(infinity))
      {
         if(base.SPxLPBase<R>::lower(n) <= R(-infinity))
            desc.colStatus(n) = SPxBasisBase<R>::Desc::P_FREE;
         else
            desc.colStatus(n) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      }
      else
      {
         if(base.SPxLPBase<R>::lower(n) <= R(-infinity))
            desc.colStatus(n) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         else if(base.SPxLPBase<R>::lower(n) >= base.SPxLPBase<R>::upper(n) - base.epsilon())
            desc.colStatus(n) = SPxBasisBase<R>::Desc::P_FIXED;
         else if(colUp[n])
            desc.colStatus(n) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         else
            desc.colStatus(n) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      }
   }
}